

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_suite.cpp
# Opt level: O1

void basic_suite::value_false(void)

{
  return_type rVar1;
  bool bVar2;
  value vVar3;
  size_type sVar4;
  value_type input [1];
  reader reader;
  uint local_b4;
  value local_b0 [9];
  uchar local_89 [1];
  reader local_88;
  
  local_89[0] = 0x80;
  trial::protocol::bintoken::reader::reader<unsigned_char[1]>(&local_88,&local_89);
  local_b0[0] = local_88.decoder.current.code;
  local_b4 = 0x80;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("reader.code()","token::code::false_value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x2a,"void basic_suite::value_false()",local_b0,&local_b4);
  local_b0[0] = trial::protocol::bintoken::token::symbol::convert(local_88.decoder.current.code);
  local_b4 = 3;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::symbol::value,trial::protocol::bintoken::token::symbol::value>
            ("reader.symbol()","token::symbol::boolean",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x2b,"void basic_suite::value_false()",local_b0,&local_b4);
  vVar3 = trial::protocol::bintoken::token::symbol::convert(local_88.decoder.current.code);
  local_b0[0] = end;
  if (vVar3 - null < 0xc) {
    local_b0[0] = *(value *)(&DAT_0011edac + (ulong)(vVar3 - null) * 4);
  }
  local_b4 = 2;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::category::value,trial::protocol::bintoken::token::category::value>
            ("reader.category()","token::category::data",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x2c,"void basic_suite::value_false()",local_b0,&local_b4);
  sVar4 = trial::protocol::bintoken::reader::length(&local_88);
  boost::detail::test_impl
            ("reader.length() == 1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x2d,"void basic_suite::value_false()",sVar4 == 1);
  rVar1 = trial::protocol::bintoken::reader::
          overloader<trial::protocol::bintoken::token::boolean,_void>::convert(&local_88);
  local_b4 = local_b4 & 0xffffff00;
  local_b0[0]._0_1_ = rVar1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.value<token::boolean>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x2f,"void basic_suite::value_false()",local_b0,&local_b4);
  trial::protocol::bintoken::reader::overloader<trial::protocol::bintoken::token::int8,_void>::
  convert(&local_88);
  boost::detail::throw_failed_impl
            ("reader.value<token::int8>()","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x31,"void basic_suite::value_false()");
  trial::protocol::bintoken::reader::overloader<trial::protocol::bintoken::token::int16,_void>::
  convert(&local_88);
  boost::detail::throw_failed_impl
            ("reader.value<token::int16>()","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x33,"void basic_suite::value_false()");
  trial::protocol::bintoken::reader::overloader<trial::protocol::bintoken::token::int32,_void>::
  convert(&local_88);
  boost::detail::throw_failed_impl
            ("reader.value<token::int32>()","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x35,"void basic_suite::value_false()");
  trial::protocol::bintoken::reader::overloader<trial::protocol::bintoken::token::int64,_void>::
  convert(&local_88);
  boost::detail::throw_failed_impl
            ("reader.value<token::int64>()","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x37,"void basic_suite::value_false()");
  trial::protocol::bintoken::reader::overloader<trial::protocol::bintoken::token::float32,_void>::
  convert(&local_88);
  boost::detail::throw_failed_impl
            ("reader.value<token::float32>()","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x39,"void basic_suite::value_false()");
  trial::protocol::bintoken::reader::overloader<trial::protocol::bintoken::token::float64,_void>::
  convert(&local_88);
  boost::detail::throw_failed_impl
            ("reader.value<token::float64>()","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x3b,"void basic_suite::value_false()");
  local_b0[0]._0_1_ = trial::protocol::bintoken::reader::overloader<bool,_void>::convert(&local_88);
  local_b4 = local_b4 & 0xffffff00;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.value<bool>()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x3d,"void basic_suite::value_false()",local_b0,&local_b4);
  trial::protocol::bintoken::reader::overloader<int,_void>::convert(&local_88);
  boost::detail::throw_failed_impl
            ("reader.value<int>()","format::error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x3f,"void basic_suite::value_false()");
  bVar2 = trial::protocol::bintoken::reader::next(&local_88);
  local_b0[0] = CONCAT31(local_b0[0]._1_3_,bVar2);
  local_b4 = local_b4 & 0xffffff00;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x40,"void basic_suite::value_false()",local_b0,&local_b4);
  local_b0[0] = local_88.decoder.current.code;
  local_b4 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("reader.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/reader_suite.cpp"
             ,0x41,"void basic_suite::value_false()",local_b0,&local_b4);
  std::
  _Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
  ::~_Deque_base((_Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
                  *)&local_88.stack);
  return;
}

Assistant:

void value_false()
{
    const value_type input[] = { token::code::false_value };
    format::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::false_value);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.symbol(), token::symbol::boolean);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.category(), token::category::data);
    TRIAL_PROTOCOL_TEST(reader.length() == 1);
    // Without conversion
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<token::boolean>(), false);
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<token::int8>(),
                                    format::error, "incompatible type");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<token::int16>(),
                                    format::error, "incompatible type");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<token::int32>(),
                                    format::error, "incompatible type");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<token::int64>(),
                                    format::error, "incompatible type");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<token::float32>(),
                                    format::error, "incompatible type");
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<token::float64>(),
                                    format::error, "incompatible type");
    // With conversion
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<bool>(), false);
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(reader.value<int>(),
                                    format::error, "invalid value");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end);
}